

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

void writeInFile(vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *image,int w,int h,string *name)

{
  long *plVar1;
  ostream *poVar2;
  pointer pVVar3;
  long *plVar4;
  size_t j;
  long lVar5;
  long lVar6;
  float fVar7;
  ofstream ofs;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::operator+(&local_250,"../images/out",name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_268 = *plVar4;
    lStack_260 = plVar1[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar4;
    local_278 = (long *)*plVar1;
  }
  local_270 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_278);
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n255\n",5);
  if (h * w != 0) {
    local_258 = (long)(h * w);
    lVar6 = 0;
    do {
      pVVar3 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar7 = pVVar3[lVar6].z;
      if (pVVar3[lVar6].z <= pVVar3[lVar6].y) {
        fVar7 = pVVar3[lVar6].y;
      }
      if (fVar7 <= pVVar3[lVar6].x) {
        fVar7 = pVVar3[lVar6].x;
      }
      if (1.0 < fVar7) {
        pVVar3 = pVVar3 + lVar6;
        fVar7 = 1.0 / fVar7;
        pVVar3->x = fVar7 * pVVar3->x;
        pVVar3->y = pVVar3->y * fVar7;
        pVVar3->z = pVVar3->z * fVar7;
      }
      lVar5 = 0;
      do {
        pVVar3 = (image->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar6;
        if (lVar5 != 0) {
          if (lVar5 == 1) {
            pVVar3 = (pointer)&pVVar3->y;
          }
          else {
            pVVar3 = (pointer)&pVVar3->z;
          }
        }
        fVar7 = pVVar3->x;
        if (1.0 <= fVar7) {
          fVar7 = 1.0;
        }
        if (fVar7 <= 0.0) {
          fVar7 = 0.0;
        }
        local_278 = (long *)CONCAT71(local_278._1_7_,(char)(int)(fVar7 * 255.0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)&local_278,1);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_258);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeInFile(std::vector<Vec3f> &image, int w, int h, std::string name){
    std::ofstream ofs;
    ofs.open("../images/out" + name + ".ppm", std::ios::binary);
    ofs << "P6\n" << w << " " << h << "\n255\n";
    for(size_t i = 0; i < h * w; i++){
        Vec3f &c = image[i];
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max>1) c = c*(1.f/max);
        for (size_t j = 0; j<3; j++) {
            ofs << (char)(255 * std::max(0.f, std::min(1.f, image[i][j])));
        }
    }
    ofs.close();
}